

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall
ktx::ValidationContext::
error<unsigned_int&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&>
          (ValidationContext *this,IssueError *issue,uint *args,uchar *args_1,uchar *args_2,
          uchar *args_3,uchar *args_4,uchar *args_5,uchar *args_6,uchar *args_7,uchar *args_8)

{
  char *pcVar1;
  string_view fmt;
  format_args args_00;
  undefined1 local_110 [8];
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string local_e8;
  ulong local_c8 [2];
  ulong local_b8;
  ulong local_a8;
  ulong local_98;
  ulong local_88;
  ulong local_78;
  ulong local_68;
  ulong local_58;
  ulong local_48;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_110[0] = (issue->super_Issue).type;
  local_110._2_2_ = (issue->super_Issue).id;
  pcVar1 = (issue->super_Issue).message._M_str;
  local_108._M_p = (pointer)&local_f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,pcVar1,pcVar1 + (issue->super_Issue).message._M_len);
  local_c8[0] = (ulong)*args;
  local_b8 = (ulong)*args_1;
  local_a8 = (ulong)*args_2;
  local_98 = (ulong)*args_3;
  local_88 = (ulong)*args_4;
  local_78 = (ulong)*args_5;
  local_68 = (ulong)*args_6;
  local_58 = (ulong)*args_7;
  local_48 = (ulong)*args_8;
  fmt.size_ = 0x222222222;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1._0_1_ = *args_2;
  args_00.desc_ = (unsigned_long_long)local_c8;
  args_00.field_1._1_7_ = 0;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_e8,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->callback)._M_invoker)((_Any_data *)&this->callback,(ValidationReport *)local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_p != &local_f8) {
      operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }